

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

void Cec_ManSatSolveCSat(Cec_ManPat_t *pPat,Gia_Man_t *pAig,Cec_ParSat_t *pPars)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vPat_00;
  Vec_Int_t *p;
  abctime aVar4;
  abctime aVar5;
  bool bVar6;
  abctime clk3;
  int iStart;
  int status;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCexStore;
  Vec_Int_t *vPat;
  Vec_Str_t *vStatus;
  Cec_ParSat_t *pPars_local;
  Gia_Man_t *pAig_local;
  Cec_ManPat_t *pPat_local;
  
  vStatus = (Vec_Str_t *)pPars;
  pPars_local = (Cec_ParSat_t *)pAig;
  pAig_local = (Gia_Man_t *)pPat;
  vPat_00 = Vec_IntAlloc(1000);
  p = Cbs_ManSolveMiterNc((Gia_Man_t *)pPars_local,vStatus->nCap,(Vec_Str_t **)&vPat,0);
  clk3._4_4_ = 0;
  iVar2 = Vec_StrSize((Vec_Str_t *)vPat);
  iVar3 = Gia_ManCoNum((Gia_Man_t *)pPars_local);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_StrSize(vStatus) == Gia_ManCoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                  ,0x304,"void Cec_ManSatSolveCSat(Cec_ManPat_t *, Gia_Man_t *, Cec_ParSat_t *)");
  }
  if (pAig_local != (Gia_Man_t *)0x0) {
    iVar2 = Vec_StrSize(*(Vec_Str_t **)&pAig_local->nRegs);
    pAig_local->nObjs = iVar2;
    pAig_local->nObjsAlloc = 0;
    *(undefined4 *)((long)&pAig_local->pObjs + 4) = 0;
    *(undefined4 *)((long)&pAig_local->pMuxes + 4) = 0;
  }
  iStart = 0;
  while( true ) {
    iVar2 = Vec_IntSize(*(Vec_Int_t **)&pPars_local[2].nCallsRecycle);
    bVar6 = false;
    if (iStart < iVar2) {
      _status = Gia_ManCo((Gia_Man_t *)pPars_local,iStart);
      bVar6 = _status != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    cVar1 = Vec_StrEntry((Vec_Str_t *)vPat,iStart);
    *(ulong *)_status = *(ulong *)_status & 0xffffffffbfffffff | (ulong)(cVar1 == '\0') << 0x1e;
    *(ulong *)_status = *(ulong *)_status & 0xbfffffffffffffff | (ulong)(cVar1 == '\x01') << 0x3e;
    iVar2 = Vec_IntSize(p);
    if ((0 < iVar2) && (cVar1 != '\x01')) {
      clk3._4_4_ = Cec_ManSatSolveExractPattern(p,clk3._4_4_,vPat_00);
    }
    if (cVar1 == '\0') {
      if ((pAig_local != (Gia_Man_t *)0x0) && (iVar2 = Vec_IntSize(vPat_00), 0 < iVar2)) {
        aVar4 = Abc_Clock();
        Cec_ManPatSavePatternCSat((Cec_ManPat_t *)pAig_local,vPat_00);
        aVar5 = Abc_Clock();
        pAig_local->pLutRefs = (int *)((aVar5 - aVar4) + (long)pAig_local->pLutRefs);
      }
      if (vStatus[1].nSize != 0) break;
    }
    iStart = iStart + 1;
  }
  iVar2 = Vec_IntSize(p);
  if (clk3._4_4_ != iVar2) {
    __assert_fail("iStart == Vec_IntSize(vCexStore)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                  ,0x321,"void Cec_ManSatSolveCSat(Cec_ManPat_t *, Gia_Man_t *, Cec_ParSat_t *)");
  }
  Vec_IntFree(vPat_00);
  Vec_StrFree((Vec_Str_t *)vPat);
  Vec_IntFree(p);
  return;
}

Assistant:

void Cec_ManSatSolveCSat( Cec_ManPat_t * pPat, Gia_Man_t * pAig, Cec_ParSat_t * pPars )
{
    Vec_Str_t * vStatus;
    Vec_Int_t * vPat = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCexStore = Cbs_ManSolveMiterNc( pAig, pPars->nBTLimit, &vStatus, 0 );
    Gia_Obj_t * pObj;
    int i, status, iStart = 0;
    assert( Vec_StrSize(vStatus) == Gia_ManCoNum(pAig) );
    // reset the manager
    if ( pPat )
    {
        pPat->iStart = Vec_StrSize(pPat->vStorage);
        pPat->nPats = 0;
        pPat->nPatLits = 0;
        pPat->nPatLitsMin = 0;
    } 
    Gia_ManForEachCo( pAig, pObj, i )
    {
        status = (int)Vec_StrEntry(vStatus, i);
        pObj->fMark0 = (status == 0);
        pObj->fMark1 = (status == 1);
        if ( Vec_IntSize(vCexStore) > 0 && status != 1 )
            iStart = Cec_ManSatSolveExractPattern( vCexStore, iStart, vPat );
        if ( status != 0 )
            continue;
        // save the pattern
        if ( pPat && Vec_IntSize(vPat) > 0 )
        {
            abctime clk3 = Abc_Clock();
            Cec_ManPatSavePatternCSat( pPat, vPat );
            pPat->timeTotalSave += Abc_Clock() - clk3;
        }
        // quit if one of them is solved
        if ( pPars->fCheckMiter )
            break;
    }
    assert( iStart == Vec_IntSize(vCexStore) );
    Vec_IntFree( vPat );
    Vec_StrFree( vStatus );
    Vec_IntFree( vCexStore );
}